

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  String *pSVar2;
  char *pcVar3;
  char (*params) [2];
  Fault local_90;
  Fault f;
  String *p_1;
  String *__end1_1;
  String *__begin1_1;
  ArrayPtr<const_kj::String> *__range1_1;
  bool leadingSlash;
  char *local_58;
  char *ptr;
  String *p;
  String *__end1;
  String *__begin1;
  ArrayPtr<const_kj::String> *__range1;
  size_t size;
  bool absolute_local;
  PathPtr *this_local;
  String *result;
  
  sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
  if (sVar1 == 0) {
    if (absolute) {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x42e735,params);
    }
    else {
      str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x42f6b4,params);
    }
  }
  else {
    sVar1 = ArrayPtr<const_kj::String>::size(&this->parts);
    __range1 = (ArrayPtr<const_kj::String> *)((ulong)absolute + (sVar1 - 1));
    __end1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar2 = ArrayPtr<const_kj::String>::end(&this->parts);
    for (; __end1 != pSVar2; __end1 = __end1 + 1) {
      sVar1 = String::size(__end1);
      __range1 = (ArrayPtr<const_kj::String> *)((long)&__range1->ptr + sVar1);
    }
    heapString(__return_storage_ptr__,(size_t)__range1);
    local_58 = String::begin(__return_storage_ptr__);
    __end1_1 = ArrayPtr<const_kj::String>::begin(&this->parts);
    pSVar2 = ArrayPtr<const_kj::String>::end(&this->parts);
    __range1_1._3_1_ = absolute;
    for (; __end1_1 != pSVar2; __end1_1 = __end1_1 + 1) {
      f.exception = (Exception *)__end1_1;
      if ((__range1_1._3_1_ & 1) != 0) {
        *local_58 = '/';
        local_58 = local_58 + 1;
      }
      __range1_1._3_1_ = 1;
      pcVar3 = String::begin(__end1_1);
      sVar1 = String::size(&(f.exception)->ownFile);
      memcpy(local_58,pcVar3,sVar1);
      sVar1 = String::size(&(f.exception)->ownFile);
      local_58 = local_58 + sVar1;
    }
    pcVar3 = String::end(__return_storage_ptr__);
    if (local_58 != pcVar3) {
      _::Debug::Fault::Fault
                (&local_90,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x96,FAILED,"ptr == result.end()","");
      _::Debug::Fault::fatal(&local_90);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}